

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O2

Task * __thiscall
depspawn::internal::TaskPool::
build_task<std::function<void(int&)>const&,std::reference_wrapper<int>>
          (TaskPool *this,Workitem *ctx,function<void_(int_&)> *f,reference_wrapper<int> *args)

{
  Task *pTVar1;
  TaskPool *local_58;
  Workitem *local_50;
  _Bind<std::function<void_(int_&)>_(std::reference_wrapper<int>)> local_48;
  
  local_58 = this;
  local_50 = ctx;
  std::_Bind<std::function<void(int&)>(std::reference_wrapper<int>)>::
  _Bind<std::reference_wrapper<int>>
            ((_Bind<std::function<void(int&)>(std::reference_wrapper<int>)> *)&local_48,f,args);
  pTVar1 = LinkedListPool<depspawn::internal::TaskPool::Task,false,false>::
           malloc<depspawn::internal::TaskPool*,depspawn::internal::Workitem*&,std::_Bind<std::function<void(int&)>(std::reference_wrapper<int>)>>
                     ((LinkedListPool<depspawn::internal::TaskPool::Task,false,false> *)
                      &this->task_pool_,&local_58,&local_50,&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return pTVar1;
}

Assistant:

Task *build_task(Workitem *ctx, F&& f, Args&&... args)
  {
    return task_pool_.malloc(this, ctx, std::bind(std::forward<F>(f), std::forward<Args>(args)...));
  }